

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load_regressor<dense_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,dense_parameters *weights)

{
  float *pfVar1;
  float fVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  size_t sVar5;
  size_t sVar6;
  weight *pwVar7;
  vw_exception *this;
  byte bVar8;
  uint uVar9;
  uint32_t uVar10;
  uint64_t *data;
  ulong uVar11;
  long lVar12;
  uint32_t old_i;
  uint64_t i;
  io_buf *local_1e8;
  weight *local_1e0;
  string local_1d8;
  stringstream msg;
  ostream local_1a8;
  
  local_1e8 = model_file;
  if (all->print_invert == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    for (p_Var4 = (all->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(all->name_index_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      uVar11 = *(long *)(p_Var4 + 2) << ((byte)weights->_stride_shift & 0x3f) &
               weights->_weight_mask;
      pwVar7 = weights->_begin;
      fVar2 = pwVar7[uVar11];
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        std::operator<<(&local_1a8,(string *)(p_Var4 + 1));
        bin_text_write_fixed(local_1e8,*(char **)(p_Var4 + 1),1,&msg,true);
        poVar3 = std::operator<<(&local_1a8,":");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,":");
        pfVar1 = pwVar7 + uVar11;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
        std::operator<<(poVar3,"\n");
        bin_text_write_fixed(local_1e8,(char *)pfVar1,4,&msg,true);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  else {
    i = 0;
    old_i = 0;
    uVar9 = all->num_bits;
    bVar8 = (byte)uVar9;
    if (read) {
      while( true ) {
        if (uVar9 < 0x1f) {
          sVar5 = io_buf::bin_read_fixed(local_1e8,(char *)&old_i,4,"");
          i = (uint64_t)old_i;
        }
        else {
          sVar5 = io_buf::bin_read_fixed(local_1e8,(char *)&i,8,"");
        }
        if (sVar5 == 0) break;
        if ((ulong)(1L << (bVar8 & 0x3f)) <= i) {
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          poVar3 = std::operator<<(&local_1a8,"Model content is corrupted, weight vector index ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3," must be less than total vector length ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                     ,0x2da,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        sVar6 = io_buf::bin_read_fixed
                          (local_1e8,
                           (char *)(weights->_begin +
                                   (i << ((byte)weights->_stride_shift & 0x3f) &
                                   weights->_weight_mask)),4,"");
        if (sVar5 + sVar6 == 0) {
          return;
        }
        uVar9 = all->num_bits;
      }
    }
    else {
      pwVar7 = weights->_begin;
      uVar10 = weights->_stride_shift;
      bVar8 = (byte)uVar10;
      local_1e0 = pwVar7;
      for (lVar12 = 0; pfVar1 = (float *)((long)local_1e0 + lVar12),
          pfVar1 != pwVar7 + weights->_weight_mask + 1; lVar12 = lVar12 + (1L << (bVar8 & 0x3f)) * 4
          ) {
        if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) {
          i = (ulong)(lVar12 >> 2) >> ((byte)uVar10 & 0x3f);
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          data = &i;
          sVar5 = 8;
          if (all->num_bits < 0x1f) {
            old_i = (uint32_t)i;
            data = (uint64_t *)&old_i;
            sVar5 = 4;
          }
          bin_text_write_fixed(local_1e8,(char *)data,sVar5,&msg,text);
          poVar3 = std::operator<<(&local_1a8,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
          std::operator<<(poVar3,"\n");
          bin_text_write_fixed(local_1e8,(char *)pfVar1,4,&msg,text);
          std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
          pwVar7 = weights->_begin;
          uVar10 = weights->_stride_shift;
        }
      }
    }
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}